

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

char * SimpleString::copyToNewBuffer(char *bufferToCopy,size_t bufferSize)

{
  char *s1;
  
  s1 = allocStringBuffer(bufferSize,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleString.cpp"
                         ,0x275);
  StrNCpy(s1,bufferToCopy,bufferSize);
  s1[bufferSize - 1] = '\0';
  return s1;
}

Assistant:

char* SimpleString::copyToNewBuffer(const char* bufferToCopy, size_t bufferSize)
{
    char* newBuffer = allocStringBuffer(bufferSize, __FILE__, __LINE__);
    StrNCpy(newBuffer, bufferToCopy, bufferSize);
    newBuffer[bufferSize-1] = '\0';
    return newBuffer;
}